

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_node.h
# Opt level: O3

bool __thiscall
BufferNode<double,_long>::range_query
          (BufferNode<double,_long> *this,bool type,double lower_bound,double upper_bound,
          vector<std::pair<double,_long>,_std::allocator<std::pair<double,_long>_>_> *answers)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  long local_40;
  double local_38;
  
  Buffer::range_query(&this->buffer,lower_bound,upper_bound,answers);
  if ((int)CONCAT71(in_register_00000031,type) == 0) {
    uVar1 = find_precise_position(this,lower_bound);
    uVar2 = this->size;
    if (uVar1 < uVar2) {
      do {
        if (lower_bound <= this->keys[uVar1]) goto LAB_001094a0;
        uVar1 = uVar1 + 1;
        uVar3 = uVar2;
      } while (uVar2 != uVar1);
      goto LAB_0010950a;
    }
  }
  else {
    uVar2 = this->size;
    uVar1 = 0;
  }
LAB_001094a0:
  uVar3 = uVar1;
  if ((uVar1 < uVar2) && (local_38 = this->keys[uVar1], local_38 <= upper_bound)) {
    do {
      uVar3 = uVar1 + 1;
      local_40 = this->payloads[uVar1];
      std::vector<std::pair<double,long>,std::allocator<std::pair<double,long>>>::
      emplace_back<double,long>
                ((vector<std::pair<double,long>,std::allocator<std::pair<double,long>>> *)answers,
                 &local_38,&local_40);
      uVar2 = this->size;
      if (uVar2 <= uVar3) break;
      local_38 = this->keys[uVar3];
      uVar1 = uVar3;
    } while (local_38 <= upper_bound);
  }
LAB_0010950a:
  return uVar2 <= uVar3;
}

Assistant:

bool range_query(bool type, K lower_bound, K upper_bound, std::vector<std::pair<K, P>>& answers) const {
        buffer.range_query(lower_bound, upper_bound, answers);
        size_t it = 0;
        if (!type) {
            it = find_precise_position(lower_bound);
            while (it < size && less_than(get_key(it), lower_bound))
                ++it;
        }
        while (it < size && !greater_than(get_key(it), upper_bound)) {
            answers.emplace_back(get_key(it), get_payload(it));
            ++it;
        }
        if (it < size)
            return false;
        else
            return true;
    }